

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11VulkanPlatform.cpp
# Opt level: O1

Display * __thiscall tcu::x11::VulkanPlatform::createWsiDisplay(VulkanPlatform *this,Type wsiType)

{
  Display *pDVar1;
  XlibDisplay *this_00;
  undefined **ppuVar2;
  NotSupportedError *this_01;
  
  if (wsiType == TYPE_XCB) {
    pDVar1 = (Display *)operator_new(0x20);
    this_00 = (XlibDisplay *)operator_new(0x20);
    XcbDisplay::XcbDisplay((XcbDisplay *)this_00,this->m_eventState,"");
    pDVar1[1]._vptr_Display = (_func_int **)this_00->m_deleteAtom;
    ppuVar2 = &PTR__VulkanDisplayXcb_00781348;
  }
  else {
    if (wsiType != TYPE_XLIB) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      NotSupportedError::NotSupportedError
                (this_01,"WSI type not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11VulkanPlatform.cpp"
                 ,0xa5);
      __cxa_throw(this_01,&NotSupportedError::typeinfo,Exception::~Exception);
    }
    pDVar1 = (Display *)operator_new(0x20);
    this_00 = (XlibDisplay *)operator_new(0x20);
    XlibDisplay::XlibDisplay(this_00,this->m_eventState,"");
    pDVar1[1]._vptr_Display = (_func_int **)this_00->m_display;
    ppuVar2 = &PTR__VulkanDisplayXlib_00781238;
  }
  pDVar1->_vptr_Display = (_func_int **)ppuVar2;
  pDVar1[2]._vptr_Display = (_func_int **)this_00;
  return pDVar1;
}

Assistant:

vk::wsi::Display* VulkanPlatform::createWsiDisplay (vk::wsi::Type wsiType) const
{
	switch(wsiType)
	{
	case vk::wsi::TYPE_XLIB:
		return new VulkanDisplayXlib(MovePtr<DisplayBase>(new XlibDisplay(m_eventState,"")));
		break;
#if defined (DEQP_SUPPORT_XCB)
	case vk::wsi::TYPE_XCB:
		return new VulkanDisplayXcb(MovePtr<DisplayBase>(new XcbDisplay(m_eventState,"")));
		break;
#endif // DEQP_SUPPORT_XCB
	default:
		TCU_THROW(NotSupportedError, "WSI type not supported");

	};
}